

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

btCollisionObject * __thiscall
btCollisionWorldImporter::getCollisionObjectByName(btCollisionWorldImporter *this,char *name)

{
  btCollisionObject **ppbVar1;
  char *in_RSI;
  btCollisionObject **bodyPtr;
  btHashString *in_stack_ffffffffffffffd0;
  btHashMap<btHashString,_btCollisionObject_*> *in_stack_ffffffffffffffd8;
  btCollisionObject *local_8;
  
  btHashString::btHashString((btHashString *)&stack0xffffffffffffffd0,in_RSI);
  ppbVar1 = btHashMap<btHashString,_btCollisionObject_*>::find
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if ((ppbVar1 == (btCollisionObject **)0x0) || (*ppbVar1 == (btCollisionObject *)0x0)) {
    local_8 = (btCollisionObject *)0x0;
  }
  else {
    local_8 = *ppbVar1;
  }
  return local_8;
}

Assistant:

btCollisionObject* btCollisionWorldImporter::getCollisionObjectByName(const char* name)
{
	btCollisionObject** bodyPtr = m_nameColObjMap.find(name);
	if (bodyPtr && *bodyPtr)
	{
		return *bodyPtr;
	}
	return 0;
}